

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpFrom::tryRead
          (BlockedPumpFrom *this,void *readBuffer,size_t minBytes,size_t maxBytes)

{
  OwnPromiseNode OVar1;
  PromiseBase PVar2;
  PromiseBase node;
  void *pvVar3;
  _func_int **in_R8;
  PromiseArena *pPVar4;
  PromiseArena *pPVar5;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_90;
  _func_int **local_88;
  _func_int **local_80;
  _func_int **local_78;
  PromiseArena *local_70;
  PromiseBase local_68;
  PromiseBase local_60;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_57;
  OwnPromiseNode intermediate;
  Fault f;
  
  _kjCondition.value = *(long *)((long)readBuffer + 0x38) == 0;
  local_68.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  if (_kjCondition.value) {
    local_70 = (PromiseArena *)((long)readBuffer + 0x38);
    pPVar4 = (PromiseArena *)
             (*(long *)((long)readBuffer + 0x28) - *(long *)((long)readBuffer + 0x30));
    pPVar5 = (PromiseArena *)maxBytes;
    if (pPVar4 < maxBytes) {
      pPVar5 = pPVar4;
    }
    local_80 = (_func_int **)minBytes;
    local_78 = in_R8;
    (**(code **)(**(long **)((long)readBuffer + 0x20) + 8))
              (&local_90,*(long **)((long)readBuffer + 0x20),minBytes,pPVar5);
    OVar1.ptr = local_90.ptr;
    local_88 = *(_func_int ***)((long)readBuffer + 0x10);
    pPVar4 = ((local_90.ptr)->super_PromiseArenaMember).arena;
    if (pPVar4 == (PromiseArena *)0x0 || (ulong)((long)local_90.ptr - (long)pPVar4) < 0x58) {
      pvVar3 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3a8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_90,
                 kj::_::
                 TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:780:17),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                 ::anon_class_40_5_41c1fbba_for_func::operator());
      *(undefined ***)((long)pvVar3 + 0x3a8) = &PTR_destroy_006478b0;
      *(void **)((long)pvVar3 + 0x3c8) = readBuffer;
      *(_func_int ***)((long)pvVar3 + 0x3d0) = local_80;
      *(size_t *)((long)pvVar3 + 0x3d8) = maxBytes;
      *(_func_int ***)((long)pvVar3 + 0x3e0) = local_78;
      *(PromiseArena **)((long)pvVar3 + 1000) = pPVar5;
      *(_func_int ***)((long)pvVar3 + 0x3f0) = local_88;
      *(PromiseArena **)((long)pvVar3 + 0x3f8) = local_70;
      *(void **)((long)pvVar3 + 0x3b0) = pvVar3;
    }
    else {
      ((local_90.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)&local_90.ptr[-6].super_PromiseArenaMember.arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_90,
                 kj::_::
                 TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:780:17),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                 ::anon_class_40_5_41c1fbba_for_func::operator());
      OVar1.ptr[-6].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006478b0;
      OVar1.ptr[-4].super_PromiseArenaMember.arena = (PromiseArena *)readBuffer;
      OVar1.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember = local_80;
      OVar1.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)maxBytes;
      OVar1.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = local_78;
      OVar1.ptr[-2].super_PromiseArenaMember.arena = pPVar5;
      OVar1.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = local_88;
      OVar1.ptr[-1].super_PromiseArenaMember.arena = local_70;
      OVar1.ptr[-5].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar4;
    }
    PVar2.node.ptr = local_68.node.ptr;
    pPVar5 = local_70;
    f.exception = (Exception *)anon_var_dwarf_a0474c;
    intermediate.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&_kjCondition,&intermediate,(SourceLocation *)&f);
    OVar1.ptr = intermediate.ptr;
    local_60.node.ptr._1_7_ = uStack_57;
    local_60.node.ptr._0_1_ = _kjCondition.value;
    if (intermediate.ptr != (PromiseNode *)0x0) {
      intermediate.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar1.ptr)->super_PromiseArenaMember);
    }
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_long>>
              ((PromiseDisposer *)&f,(Canceler *)pPVar5,(Promise<unsigned_long> *)&local_60);
    node.node.ptr = local_60.node.ptr;
    *(Exception **)PVar2.node.ptr = f.exception;
    if (local_60.node.ptr != (PromiseNode *)0x0) {
      local_60.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
    }
    OVar1.ptr = local_90.ptr;
    if (&(local_90.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_90.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar1.ptr)->super_PromiseArenaMember);
    }
    return (Promise<unsigned_long>)(PromiseNode *)PVar2.node.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x306,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
             (char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}